

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int ssl_prepare_handshake_record(mbedtls_ssl_context *ssl)

{
  uint *puVar1;
  ulong uVar2;
  byte *pbVar3;
  mbedtls_ssl_handshake_params *pmVar4;
  int *piVar5;
  bool bVar6;
  uchar *puVar7;
  uint uVar8;
  int iVar9;
  size_t sVar10;
  long lVar11;
  ushort uVar12;
  ulong uVar13;
  int unaff_EBP;
  byte bVar14;
  byte bVar15;
  char *pcVar16;
  ulong uVar17;
  uint uVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  size_t sVar22;
  uchar *puVar23;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 uVar24;
  undefined4 uVar27;
  ulong uVar25;
  size_t sVar26;
  uint local_48;
  
  uVar13 = (ulong)((ssl->conf->field_0x164 & 2) >> 1) * 8 + 4;
  if (ssl->in_msglen < uVar13) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0xbfe,"handshake message too short: %d");
    return -0x7200;
  }
  pbVar3 = ssl->in_msg;
  uVar13 = ((ulong)pbVar3[3] | (ulong)((uint)pbVar3[2] << 8 | (uint)pbVar3[1] << 0x10)) + uVar13;
  ssl->in_hslen = uVar13;
  uVar24 = CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(uint)*pbVar3);
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0xc09,"handshake message: msglen = %d, type = %d, hslen = %d",ssl->in_msglen,uVar24,
             uVar13);
  if ((ssl->conf->field_0x164 & 2) == 0) {
    if (ssl->in_msglen < ssl->in_hslen) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xc47,"TLS handshake fragmentation not supported");
      return -0x7080;
    }
    goto LAB_0013d23a;
  }
  pmVar4 = ssl->handshake;
  puVar7 = ssl->in_msg;
  if (pmVar4 != (mbedtls_ssl_handshake_params *)0x0) {
    uVar12 = *(ushort *)(puVar7 + 4) << 8 | *(ushort *)(puVar7 + 4) >> 8;
    if ((uint)uVar12 == pmVar4->in_msg_seq) goto LAB_0013ce84;
    uVar27 = (undefined4)((ulong)uVar24 >> 0x20);
    if (((uint)uVar12 != pmVar4->in_flight_start_seq - 1) || (*puVar7 == '\x03')) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xc2b,"dropping out-of-sequence message: message_seq = %d, expected = %d",
                 (ulong)uVar12,CONCAT44(uVar27,pmVar4->in_msg_seq),uVar13);
LAB_0013cf7c:
      bVar6 = false;
      unaff_EBP = -0x6900;
      goto LAB_0013d231;
    }
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0xc1e,"received message from last flight, message_seq = %d, start_of_flight = %d",
               (ulong)uVar12,CONCAT44(uVar27,pmVar4->in_flight_start_seq),uVar13);
    unaff_EBP = mbedtls_ssl_resend(ssl);
    if (unaff_EBP == 0) goto LAB_0013cf7c;
    pcVar16 = "mbedtls_ssl_resend";
    iVar9 = 0xc22;
    goto LAB_0013d221;
  }
LAB_0013ce84:
  if ((((ssl->in_msglen < ssl->in_hslen) || (puVar7[8] != '\0' || *(short *)(puVar7 + 6) != 0)) ||
      (puVar7[0xb] != puVar7[3] || *(short *)(puVar7 + 9) != *(short *)(puVar7 + 1))) ||
     ((bVar6 = true, pmVar4 != (mbedtls_ssl_handshake_params *)0x0 &&
      (pmVar4->hs_msg != (uchar *)0x0)))) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0xc39,"found fragmented DTLS handshake message");
    if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
      pcVar16 = "not supported outside handshake (for now)";
      iVar9 = 0xb6d;
LAB_0013cfa1:
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,iVar9,pcVar16);
      unaff_EBP = -0x7080;
    }
    else {
      sVar22 = ssl->in_hslen;
      uVar17 = sVar22 - 0xc;
      piVar5 = (int *)ssl->handshake->hs_msg;
      if (piVar5 == (int *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0xb79,"initialize reassembly, total length = %d",uVar17,uVar24,uVar13);
        if (ssl->in_hslen < 0x4001) {
          sVar10 = ((uVar17 >> 3) + sVar22 + 1) - (ulong)((uVar17 & 7) == 0);
          puVar7 = (uchar *)calloc(1,sVar10);
          pmVar4 = ssl->handshake;
          pmVar4->hs_msg = puVar7;
          if (puVar7 == (uchar *)0x0) {
            bVar6 = false;
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0xb87,"alloc failed (%d bytes)",sVar10,uVar24,uVar13);
            unaff_EBP = -0x7f00;
          }
          else {
            puVar23 = ssl->in_msg;
            *(undefined2 *)(puVar7 + 4) = *(undefined2 *)(puVar23 + 4);
            *(undefined4 *)puVar7 = *(undefined4 *)puVar23;
            puVar7 = pmVar4->hs_msg;
            puVar7[8] = '\0';
            puVar7[6] = '\0';
            puVar7[7] = '\0';
            puVar7 = ssl->handshake->hs_msg;
            puVar7[0xb] = puVar7[3];
            *(undefined2 *)(puVar7 + 9) = *(undefined2 *)(puVar7 + 1);
            bVar6 = true;
          }
        }
        else {
          bVar6 = false;
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0xb7d,"handshake message too large");
          unaff_EBP = -0x7080;
        }
        if (!bVar6) goto LAB_0013d202;
LAB_0013d14b:
        puVar7 = ssl->in_msg;
        bVar19 = puVar7[8];
        uVar21 = (ulong)((uint)puVar7[7] << 8 | (uint)puVar7[6] << 0x10) | (ulong)bVar19;
        uVar20 = (uint)puVar7[10] << 8 | (uint)puVar7[9] << 0x10;
        bVar14 = puVar7[0xb];
        sVar10 = (ulong)uVar20 + (ulong)bVar14;
        if (uVar17 < sVar10 + uVar21) {
          pcVar16 = "invalid fragment offset/len: %d + %d > %d";
          iVar9 = 0xbac;
          uVar25 = sVar10;
          uVar13 = uVar17;
        }
        else {
          uVar2 = sVar10 + 0xc;
          uVar25 = ssl->in_msglen;
          if (uVar2 <= uVar25) {
            puVar7 = ssl->handshake->hs_msg;
            sVar26 = sVar10;
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,3000,"adding fragment, offset = %d, length = %d",uVar21,sVar10,uVar13);
            memcpy(puVar7 + uVar21 + 0xc,ssl->in_msg + 0xc,sVar10);
            bVar19 = bVar19 & 7;
            if (bVar19 == 0) {
LAB_0013d384:
              if ((sVar10 & 7) != 0) {
                uVar13 = uVar21 + sVar10 >> 3;
                bVar19 = puVar7[uVar13 + sVar22];
                iVar9 = 8 - ((uint)sVar10 & 7);
                do {
                  bVar19 = bVar19 | (byte)(1 << ((byte)iVar9 & 0x1f));
                  iVar9 = iVar9 + 1;
                } while (iVar9 != 8);
                puVar7[uVar13 + sVar22] = bVar19;
              }
              memset(puVar7 + (uVar21 >> 3) + sVar22,0xff,sVar10 >> 3);
            }
            else {
              bVar19 = 8 - bVar19;
              uVar13 = uVar21 >> 3;
              uVar18 = (uint)sVar10;
              uVar8 = (uint)bVar19;
              if (uVar18 < bVar19 || uVar18 == uVar8) {
                if (sVar10 != 0) {
                  bVar15 = puVar7[uVar13 + sVar22];
                  local_48 = (uint)bVar14;
                  iVar9 = uVar8 - (uVar20 + local_48);
                  do {
                    bVar15 = bVar15 | (byte)(1 << ((byte)iVar9 & 0x1f));
                    iVar9 = iVar9 + 1;
                    sVar10 = sVar10 - 1;
                  } while (sVar10 != 0);
                  puVar7[uVar13 + sVar22] = bVar15;
                }
                sVar10 = 0;
              }
              else {
                bVar14 = puVar7[uVar13 + sVar22];
                do {
                  uVar8 = uVar8 - 1;
                  bVar14 = bVar14 | (byte)(1 << ((byte)uVar8 & 0x1f));
                } while (uVar8 != 0);
                uVar21 = uVar21 + bVar19;
                sVar10 = sVar10 - bVar19;
                puVar7[uVar13 + sVar22] = bVar14;
              }
              if (bVar19 < uVar18) goto LAB_0013d384;
            }
            uVar13 = uVar17 >> 3;
            if (7 < uVar17) {
              uVar21 = 0;
              do {
                if (puVar7[uVar21 + sVar22] != 0xff) goto LAB_0013d469;
                uVar21 = uVar21 + 1;
              } while (uVar13 != uVar21);
            }
            uVar21 = uVar17 & 7;
            uVar17 = uVar21;
            if (uVar21 != 0) {
              uVar17 = -uVar21;
              lVar11 = 0;
              do {
                if ((puVar7[uVar13 + sVar22] >> ((int)lVar11 + 7U & 0x1f) & 1) == 0)
                goto LAB_0013d469;
                lVar11 = lVar11 + -1;
              } while (-lVar11 != uVar21);
            }
            mbedtls_debug_print_msg
                      (ssl,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0xbc7,"handshake message completed",uVar17,sVar26);
            if (ssl->in_msglen <= uVar2) {
              uVar13 = ssl->next_record_offset;
              sVar10 = ssl->in_left - uVar13;
              if (uVar13 <= ssl->in_left && sVar10 != 0) {
                puVar7 = ssl->in_hdr;
                sVar22 = (long)(ssl->in_msg + ssl->in_hslen) - (long)puVar7;
                ssl->next_record_offset = sVar22;
                puVar23 = (uchar *)(sVar22 + sVar10);
                ssl->in_left = (size_t)puVar23;
                if (ssl->in_buf + (0x414d - (long)puVar7) < puVar23) {
                  mbedtls_debug_print_msg
                            (ssl,1,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                             ,0xbe6,"reassembled message too large for buffer");
                  unaff_EBP = -0x6a00;
                  goto LAB_0013d202;
                }
                memmove(ssl->in_msg + ssl->in_hslen,puVar7 + uVar13,sVar10);
              }
              memcpy(ssl->in_msg,ssl->handshake->hs_msg,ssl->in_hslen);
              free(ssl->handshake->hs_msg);
              ssl->handshake->hs_msg = (uchar *)0x0;
              mbedtls_debug_print_buf
                        (ssl,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                         ,0xbf3,"reassembled handshake message",ssl->in_msg,ssl->in_hslen);
              unaff_EBP = 0;
              goto LAB_0013d202;
            }
            pcVar16 = "last fragment not alone in its record";
            iVar9 = 0xbd0;
            goto LAB_0013cfa1;
          }
          pcVar16 = "invalid fragment length: %d + 12 > %d";
          iVar9 = 0xbb3;
          uVar21 = sVar10;
        }
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,iVar9,pcVar16,uVar21,uVar25,uVar13);
      }
      else {
        if (*piVar5 == *(int *)ssl->in_msg) goto LAB_0013d14b;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0xb97,"fragment header mismatch",uVar17,uVar24,uVar13);
      }
      unaff_EBP = -0x7200;
    }
    goto LAB_0013d202;
  }
LAB_0013d231:
  if (!bVar6) {
    return unaff_EBP;
  }
LAB_0013d23a:
  if ((ssl->state != 0x10) && (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0)) {
    (*ssl->handshake->update_checksum)(ssl,ssl->in_msg,ssl->in_hslen);
  }
  if (((ssl->conf->field_0x164 & 2) != 0) && (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0)
     ) {
    puVar1 = &ssl->handshake->in_msg_seq;
    *puVar1 = *puVar1 + 1;
  }
  return 0;
LAB_0013d469:
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0xbc3,"message is not complete yet",uVar17,sVar26);
  unaff_EBP = -0x6900;
LAB_0013d202:
  if (unaff_EBP == 0) {
    bVar6 = true;
  }
  else {
    pcVar16 = "ssl_reassemble_dtls_handshake";
    iVar9 = 0xc3d;
LAB_0013d221:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,iVar9,pcVar16,unaff_EBP);
    bVar6 = false;
  }
  goto LAB_0013d231;
}

Assistant:

static int ssl_prepare_handshake_record( mbedtls_ssl_context *ssl )
{
    if( ssl->in_msglen < mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake message too short: %d",
                            ssl->in_msglen ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    ssl->in_hslen = mbedtls_ssl_hs_hdr_len( ssl ) + (
                    ( ssl->in_msg[1] << 16 ) |
                    ( ssl->in_msg[2] << 8  ) |
                      ssl->in_msg[3] );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "handshake message: msglen ="
                        " %d, type = %d, hslen = %d",
                        ssl->in_msglen, ssl->in_msg[0], ssl->in_hslen ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        int ret;
        unsigned int recv_msg_seq = ( ssl->in_msg[4] << 8 ) | ssl->in_msg[5];

        /* ssl->handshake is NULL when receiving ClientHello for renego */
        if( ssl->handshake != NULL &&
            recv_msg_seq != ssl->handshake->in_msg_seq )
        {
            /* Retransmit only on last message from previous flight, to avoid
             * too many retransmissions.
             * Besides, No sane server ever retransmits HelloVerifyRequest */
            if( recv_msg_seq == ssl->handshake->in_flight_start_seq - 1 &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "received message from last flight, "
                                    "message_seq = %d, start_of_flight = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_flight_start_seq ) );

                if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_resend", ret );
                    return( ret );
                }
            }
            else
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "dropping out-of-sequence message: "
                                    "message_seq = %d, expected = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_msg_seq ) );
            }

            return( MBEDTLS_ERR_SSL_WANT_READ );
        }
        /* Wait until message completion to increment in_msg_seq */

        /* Reassemble if current message is fragmented or reassembly is
         * already in progress */
        if( ssl->in_msglen < ssl->in_hslen ||
            memcmp( ssl->in_msg + 6, "\0\0\0",        3 ) != 0 ||
            memcmp( ssl->in_msg + 9, ssl->in_msg + 1, 3 ) != 0 ||
            ( ssl->handshake != NULL && ssl->handshake->hs_msg != NULL ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "found fragmented DTLS handshake message" ) );

            if( ( ret = ssl_reassemble_dtls_handshake( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_reassemble_dtls_handshake", ret );
                return( ret );
            }
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    /* With TLS we don't handle fragmentation (for now) */
    if( ssl->in_msglen < ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLS handshake fragmentation not supported" ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER &&
        ssl->handshake != NULL )
    {
        ssl->handshake->update_checksum( ssl, ssl->in_msg, ssl->in_hslen );
    }

    /* Handshake message is complete, increment counter */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL )
    {
        ssl->handshake->in_msg_seq++;
    }
#endif

    return( 0 );
}